

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmm.c
# Opt level: O0

int stmm_gen_int(stmm_generator *gen,char **key_p,long *value_p)

{
  int local_2c;
  int i;
  long *value_p_local;
  char **key_p_local;
  stmm_generator *gen_local;
  
  if (gen->entry == (stmm_table_entry *)0x0) {
    for (local_2c = gen->index; local_2c < gen->table->num_bins; local_2c = local_2c + 1) {
      if (gen->table->bins[local_2c] != (stmm_table_entry *)0x0) {
        gen->index = local_2c + 1;
        gen->entry = gen->table->bins[local_2c];
        break;
      }
    }
    if (gen->entry == (stmm_table_entry *)0x0) {
      return 0;
    }
  }
  *key_p = gen->entry->key;
  if (value_p != (long *)0x0) {
    *value_p = (long)gen->entry->record;
  }
  gen->entry = gen->entry->next;
  return 1;
}

Assistant:

int
stmm_gen_int (stmm_generator *gen, char **key_p, long *value_p)
{
    int i;

    if (gen->entry == NULL) {
    /* try to find next entry */
    for (i = gen->index; i < gen->table->num_bins; i++) {
        if (gen->table->bins[i] != NULL) {
        gen->index = i + 1;
        gen->entry = gen->table->bins[i];
        break;
        }
    }
    if (gen->entry == NULL) {
        return 0;       /* that's all folks ! */
    }
    }
    *key_p = gen->entry->key;
    if (value_p != 0)
    {
    *value_p = (long) gen->entry->record;
    }
    gen->entry = gen->entry->next;
    return 1;
}